

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

void __thiscall cppnet::RWSocket::~RWSocket(RWSocket *this)

{
  ~RWSocket((RWSocket *)&this[-1].super_CNSocket);
  operator_delete(&this[-1].super_CNSocket);
  return;
}

Assistant:

RWSocket::~RWSocket() {
    _write_buffer.reset();
    _read_buffer.reset();
    if (_alloter && _event) {
        _alloter->PoolDelete(_event);
    }
    if (_timer_id > 0) {
        auto dispatcher = GetDispatcher();
        if (dispatcher) {
            dispatcher->StopTimer(_timer_id);
        }
        _timer_id = 0;
    }
}